

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

char * get_ea_mode_str(uint instruction,uint size)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  char base_reg [4];
  char index_reg [8];
  
  pcVar9 = get_ea_mode_str::b2;
  if (get_ea_mode_str::mode != get_ea_mode_str::b1) {
    pcVar9 = get_ea_mode_str::b1;
  }
  uVar8 = (ulong)(instruction & 0x3f);
  get_ea_mode_str::mode = pcVar9;
  switch(uVar8) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    pcVar11 = "D%d";
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pcVar11 = "A%d";
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    pcVar11 = "(A%d)";
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    pcVar11 = "(A%d)+";
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    pcVar11 = "-(A%d)";
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar4 = dasm_read_imm_16(instruction);
    make_signed_hex_str_16(uVar4);
    sprintf(pcVar9,"(%s,A%d)",make_signed_hex_str_16::str,(ulong)(instruction & 7));
    return get_ea_mode_str::mode;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    uVar12 = instruction;
    uVar4 = dasm_read_imm_16(instruction);
    pcVar9 = get_ea_mode_str::mode;
    if ((uVar4 >> 8 & 1) == 0) {
      if ((char)uVar4 == '\0') {
        uVar1 = 0x6c;
        if ((uVar4 >> 0xb & 1) == 0) {
          uVar1 = 0x77;
        }
        sprintf(get_ea_mode_str::mode,"(A%d,%c%d.%c",(ulong)(instruction & 7),
                (ulong)((uint)(uVar4 < 0x8000) * 3 + 0x41),(ulong)(uVar4 >> 0xc & 7),uVar1);
      }
      else {
        make_signed_hex_str_8(uVar4);
        uVar6 = instruction & 7;
        uVar12 = (uint)(uVar4 < 0x8000) * 3 + 0x41;
        uVar8 = (ulong)(uVar4 >> 0xc & 7);
        pcVar11 = "(%s,A%d,%c%d.%c";
LAB_002ff995:
        sprintf(pcVar9,pcVar11,make_signed_hex_str_8::str,(ulong)uVar6,(ulong)uVar12,uVar8);
      }
LAB_002ffa43:
      pcVar9 = get_ea_mode_str::mode;
      uVar4 = uVar4 >> 9 & 3;
      if (uVar4 != 0) {
        sVar5 = strlen(get_ea_mode_str::mode);
        sprintf(pcVar9 + sVar5,"*%d",(ulong)(uint)(1 << (sbyte)uVar4));
      }
      goto LAB_002ffdee;
    }
    if ((uVar4 & 0xe4) == 0xc4 || (uVar4 & 0xe2) == 0xc0) {
LAB_002ff9c5:
      pcVar9 = get_ea_mode_str::mode;
      pcVar9[0] = '0';
      pcVar9[1] = '\0';
      return get_ea_mode_str::mode;
    }
    uVar13 = uVar4 & 0x30;
    uVar6 = 0;
    uVar10 = 0;
    if (0x10 < uVar13) {
      if (uVar13 == 0x30) {
        uVar10 = dasm_read_imm_32(uVar12);
      }
      else {
        uVar10 = dasm_read_imm_16(uVar12);
      }
    }
    uVar14 = uVar4 & 3;
    uVar7 = uVar4 & 0x44;
    if (uVar7 != 0x44 && 1 < uVar14) {
      if (uVar14 == 3) {
        uVar6 = dasm_read_imm_32(uVar12);
      }
      else {
        uVar6 = dasm_read_imm_16(uVar12);
      }
    }
    if ((char)uVar4 < '\0') {
      base_reg._0_2_ = base_reg._0_2_ & 0xff00;
    }
    else {
      sprintf(base_reg,"A%d",(ulong)(instruction & 7));
    }
    if ((uVar4 & 0x40) == 0) {
      uVar1 = 0x6c;
      if ((uVar4 >> 0xb & 1) == 0) {
        uVar1 = 0x77;
      }
      sprintf(index_reg,"%c%d.%c",(ulong)((uint)(uVar4 < 0x8000) * 3 + 0x41),
              (ulong)(uVar4 >> 0xc & 7),uVar1);
      uVar12 = uVar4 >> 9 & 3;
      if (uVar12 != 0) {
        sVar5 = strlen(index_reg);
        sprintf(index_reg + sVar5,"*%d",(ulong)(uint)(1 << (sbyte)uVar12));
      }
    }
    else {
      index_reg[0] = '\0';
    }
    pcVar9 = get_ea_mode_str::mode;
    uVar4 = uVar4 & 7;
    pcVar9[0] = '(';
    pcVar9[1] = '\0';
    if (4 < uVar4 || uVar4 - 1 < 3) {
      sVar5 = strlen(pcVar9);
      (pcVar9 + sVar5)[0] = '[';
      (pcVar9 + sVar5)[1] = '\0';
    }
    if (uVar10 == 0) {
      if (base_reg[0] != '\0') goto LAB_002ffd0c;
      bVar3 = false;
      bVar2 = true;
    }
    else {
      if (uVar13 == 0x30) {
        make_signed_hex_str_32(uVar10);
        pcVar11 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar10);
        pcVar11 = make_signed_hex_str_16::str;
      }
      strcat(pcVar9,pcVar11);
      pcVar9 = get_ea_mode_str::mode;
      if (base_reg[0] != '\0') {
        sVar5 = strlen(get_ea_mode_str::mode);
        (pcVar9 + sVar5)[0] = ',';
        (pcVar9 + sVar5)[1] = '\0';
LAB_002ffd0c:
        strcat(pcVar9,base_reg);
      }
      bVar3 = true;
      bVar2 = false;
    }
    pcVar9 = get_ea_mode_str::mode;
    if (uVar4 < 5) {
      if (index_reg[0] != '\0') {
        if (!bVar2) goto LAB_002ffd53;
        goto LAB_002ffd61;
      }
LAB_002ffd71:
      pcVar9 = get_ea_mode_str::mode;
      if (uVar4 - 1 < 3) {
        sVar5 = strlen(get_ea_mode_str::mode);
        (pcVar9 + sVar5)[0] = ']';
        (pcVar9 + sVar5)[1] = '\0';
        goto LAB_002ffd8c;
      }
    }
    else {
      sVar5 = strlen(get_ea_mode_str::mode);
      (pcVar9 + sVar5)[0] = ']';
      (pcVar9 + sVar5)[1] = '\0';
      if (index_reg[0] != '\0') {
LAB_002ffd53:
        sVar5 = strlen(pcVar9);
        (pcVar9 + sVar5)[0] = ',';
        (pcVar9 + sVar5)[1] = '\0';
LAB_002ffd61:
        strcat(pcVar9,index_reg);
        bVar3 = true;
        goto LAB_002ffd71;
      }
LAB_002ffd8c:
      bVar3 = true;
    }
    pcVar9 = get_ea_mode_str::mode;
    if (uVar6 == 0) goto LAB_002ffdee;
    if (bVar3) {
      sVar5 = strlen(get_ea_mode_str::mode);
      (pcVar9 + sVar5)[0] = ',';
      (pcVar9 + sVar5)[1] = '\0';
    }
    goto LAB_002ffdbc;
  case 0x38:
    uVar4 = dasm_read_imm_16(instruction);
    pcVar11 = "$%x.w";
    goto LAB_002ffb24;
  case 0x39:
    uVar4 = dasm_read_imm_32(instruction);
    pcVar11 = "$%x.l";
LAB_002ffb24:
    uVar8 = (ulong)uVar4;
    goto LAB_002ff8e2;
  case 0x3a:
    uVar4 = dasm_read_imm_16(instruction);
    pcVar9 = get_ea_mode_str::mode;
    make_signed_hex_str_16(uVar4);
    sprintf(pcVar9,"(%s,PC)",make_signed_hex_str_16::str);
    uVar8 = (ulong)((g_cpu_pc + (uint)(uVar4 < 0x8000) * 0x10000 + uVar4) - 0x10002);
    pcVar9 = g_helper_str;
    pcVar11 = "; ($%x)";
    goto LAB_002ff8e2;
  case 0x3b:
    uVar4 = dasm_read_imm_16(instruction);
    pcVar9 = get_ea_mode_str::mode;
    cVar15 = (char)uVar4;
    if ((uVar4 >> 8 & 1) == 0) {
      if (cVar15 != '\0') {
        make_signed_hex_str_8(uVar4);
        uVar6 = (uint)(uVar4 < 0x8000) * 3 + 0x41;
        uVar12 = uVar4 >> 0xc & 7;
        uVar8 = 0x6c;
        if ((uVar4 >> 0xb & 1) == 0) {
          uVar8 = 0x77;
        }
        pcVar11 = "(%s,PC,%c%d.%c";
        goto LAB_002ff995;
      }
      uVar1 = 0x6c;
      if ((uVar4 >> 0xb & 1) == 0) {
        uVar1 = 0x77;
      }
      sprintf(get_ea_mode_str::mode,"(PC,%c%d.%c",(ulong)((uint)(uVar4 < 0x8000) * 3 + 0x41),
              (ulong)(uVar4 >> 0xc & 7),uVar1);
      goto LAB_002ffa43;
    }
    if ((uVar4 & 0xe4) == 0xc4 || (uVar4 & 0xe2) == 0xc0) goto LAB_002ff9c5;
    uVar10 = uVar4 & 0x30;
    uVar6 = 0;
    uVar12 = 0;
    if (0x10 < uVar10) {
      if (uVar10 == 0x30) {
        uVar12 = dasm_read_imm_32(instruction);
      }
      else {
        uVar12 = dasm_read_imm_16(instruction);
      }
    }
    uVar14 = uVar4 & 3;
    uVar7 = uVar4 & 0x44;
    if (uVar7 != 0x44 && 1 < uVar14) {
      if (uVar14 == 3) {
        uVar6 = dasm_read_imm_32(instruction);
      }
      else {
        uVar6 = dasm_read_imm_16(instruction);
      }
    }
    if (cVar15 < '\0') {
      base_reg._0_2_ = (ushort)(byte)base_reg[1] << 8;
    }
    else {
      base_reg[2] = '\0';
      base_reg[0] = 'P';
      base_reg[1] = 'C';
    }
    if ((uVar4 & 0x40) == 0) {
      uVar1 = 0x6c;
      if ((uVar4 >> 0xb & 1) == 0) {
        uVar1 = 0x77;
      }
      sprintf(index_reg,"%c%d.%c",(ulong)((uint)(uVar4 < 0x8000) * 3 + 0x41),
              (ulong)(uVar4 >> 0xc & 7),uVar1);
      uVar13 = uVar4 >> 9 & 3;
      if (uVar13 != 0) {
        sVar5 = strlen(index_reg);
        sprintf(index_reg + sVar5,"*%d",(ulong)(uint)(1 << (sbyte)uVar13));
      }
    }
    else {
      index_reg[0] = '\0';
    }
    pcVar9 = get_ea_mode_str::mode;
    uVar4 = uVar4 & 7;
    pcVar9[0] = '(';
    pcVar9[1] = '\0';
    if (4 < uVar4 || uVar4 - 1 < 3) {
      sVar5 = strlen(pcVar9);
      (pcVar9 + sVar5)[0] = '[';
      (pcVar9 + sVar5)[1] = '\0';
    }
    bVar2 = true;
    if (uVar12 == 0) {
      if (-1 < cVar15) goto LAB_002ffffb;
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (uVar10 == 0x30) {
        make_signed_hex_str_32(uVar12);
        pcVar11 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar12);
        pcVar11 = make_signed_hex_str_16::str;
      }
      strcat(pcVar9,pcVar11);
      pcVar9 = get_ea_mode_str::mode;
      if (-1 < cVar15) {
        sVar5 = strlen(get_ea_mode_str::mode);
        (pcVar9 + sVar5)[0] = ',';
        (pcVar9 + sVar5)[1] = '\0';
LAB_002ffffb:
        strcat(pcVar9,base_reg);
      }
      bVar3 = false;
    }
    pcVar9 = get_ea_mode_str::mode;
    if (uVar4 < 5) {
      if (index_reg[0] != '\0') {
        if (!bVar3) goto LAB_00300043;
        goto LAB_00300051;
      }
LAB_00300062:
      pcVar9 = get_ea_mode_str::mode;
      if (uVar4 - 1 < 3) {
        sVar5 = strlen(get_ea_mode_str::mode);
        (pcVar9 + sVar5)[0] = ']';
        (pcVar9 + sVar5)[1] = '\0';
        goto LAB_0030007e;
      }
    }
    else {
      sVar5 = strlen(get_ea_mode_str::mode);
      (pcVar9 + sVar5)[0] = ']';
      (pcVar9 + sVar5)[1] = '\0';
      if (index_reg[0] != '\0') {
LAB_00300043:
        sVar5 = strlen(pcVar9);
        (pcVar9 + sVar5)[0] = ',';
        (pcVar9 + sVar5)[1] = '\0';
LAB_00300051:
        strcat(pcVar9,index_reg);
        bVar2 = true;
        goto LAB_00300062;
      }
LAB_0030007e:
      bVar2 = true;
    }
    pcVar9 = get_ea_mode_str::mode;
    if (uVar6 == 0) goto LAB_002ffdee;
    if (bVar2) {
      sVar5 = strlen(get_ea_mode_str::mode);
      (pcVar9 + sVar5)[0] = ',';
      (pcVar9 + sVar5)[1] = '\0';
    }
LAB_002ffdbc:
    pcVar9 = get_ea_mode_str::mode;
    if (uVar14 == 3 && uVar7 != 0x44) {
      make_signed_hex_str_32(uVar6);
      pcVar11 = make_signed_hex_str_32::str;
    }
    else {
      make_signed_hex_str_16(uVar6);
      pcVar11 = make_signed_hex_str_16::str;
    }
    strcat(pcVar9,pcVar11);
LAB_002ffdee:
    pcVar9 = get_ea_mode_str::mode;
    sVar5 = strlen(get_ea_mode_str::mode);
    (pcVar9 + sVar5)[0] = ')';
    (pcVar9 + sVar5)[1] = '\0';
    return get_ea_mode_str::mode;
  case 0x3c:
    get_imm_str_u(size);
    strcpy(pcVar9,get_imm_str_u::str);
    return get_ea_mode_str::mode;
  default:
    pcVar11 = "INVALID $%x";
    goto LAB_002ff8e2;
  }
  uVar8 = (ulong)(instruction & 7);
LAB_002ff8e2:
  sprintf(pcVar9,pcVar11,uVar8);
  return get_ea_mode_str::mode;
}

Assistant:

static char* get_ea_mode_str(uint instruction, uint size)
{
	static char b1[64];
	static char b2[64];
	static char* mode = b2;
	uint extension;
	uint base;
	uint outer;
	char base_reg[4];
	char index_reg[8];
	uint preindex;
	uint postindex;
	uint comma = 0;
	uint temp_value;

	/* Switch buffers so we don't clobber on a double-call to this function */
	mode = mode == b1 ? b2 : b1;

	switch(instruction & 0x3f)
	{
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
		/* data register direct */
			sprintf(mode, "D%d", instruction&7);
			break;
		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
		/* address register direct */
			sprintf(mode, "A%d", instruction&7);
			break;
		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
		/* address register indirect */
			sprintf(mode, "(A%d)", instruction&7);
			break;
		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
		/* address register indirect with postincrement */
			sprintf(mode, "(A%d)+", instruction&7);
			break;
		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
		/* address register indirect with predecrement */
			sprintf(mode, "-(A%d)", instruction&7);
			break;
		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
		/* address register indirect with displacement*/
			sprintf(mode, "(%s,A%d)", make_signed_hex_str_16(read_imm_16()), instruction&7);
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
		/* address register indirect with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					sprintf(base_reg, "A%d", instruction&7);
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
				if(base)
				{
					if (EXT_BASE_DISPLACEMENT_LONG(extension))
					{
						strcat(mode, make_signed_hex_str_32(base));
					}
					else
					{
						strcat(mode, make_signed_hex_str_16(base));
					}
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(A%d,%c%d.%c", instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,A%d,%c%d.%c", make_signed_hex_str_8(extension), instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x38:
		/* absolute short address */
			sprintf(mode, "$%x.w", read_imm_16());
			break;
		case 0x39:
		/* absolute long address */
			sprintf(mode, "$%x.l", read_imm_32());
			break;
		case 0x3a:
		/* program counter with displacement */
			temp_value = read_imm_16();
			sprintf(mode, "(%s,PC)", make_signed_hex_str_16(temp_value));
			sprintf(g_helper_str, "; ($%x)", (make_int_16(temp_value) + g_cpu_pc-2) & 0xffffffff);
			break;
		case 0x3b:
		/* program counter with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					strcpy(base_reg, "PC");
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
                if(base)
                {
                    if (EXT_BASE_DISPLACEMENT_LONG(extension))
                    {
                        strcat(mode, make_signed_hex_str_32(base));
                    }
                    else
                    {
                        strcat(mode, make_signed_hex_str_16(base));
                    }
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(PC,%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,PC,%c%d.%c", make_signed_hex_str_8(extension), EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x3c:
		/* Immediate */
			sprintf(mode, "%s", get_imm_str_u(size));
			break;
		default:
			sprintf(mode, "INVALID $%x", instruction & 0x3f);
	}
	return mode;
}